

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_ldrddi.cpp
# Opt level: O0

ze_result_t
loader::zesPowerSetLimitsExt
          (zes_pwr_handle_t hPower,uint32_t *pCount,zes_power_limit_ext_desc_t *pSustained)

{
  zes_pfnPowerSetLimitsExt_t pfnSetLimitsExt;
  dditable_t *dditable;
  ze_result_t result;
  zes_power_limit_ext_desc_t *pSustained_local;
  uint32_t *pCount_local;
  zes_pwr_handle_t hPower_local;
  
  if (*(code **)(*(long *)(hPower + 8) + 0xad0) == (code *)0x0) {
    hPower_local._4_4_ = ZE_RESULT_ERROR_UNINITIALIZED;
  }
  else {
    hPower_local._4_4_ =
         (**(code **)(*(long *)(hPower + 8) + 0xad0))(*(undefined8 *)hPower,pCount,pSustained);
  }
  return hPower_local._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zesPowerSetLimitsExt(
        zes_pwr_handle_t hPower,                        ///< [in] Handle for the component.
        uint32_t* pCount,                               ///< [in] Pointer to the number of power limit descriptors.
        zes_power_limit_ext_desc_t* pSustained          ///< [in][optional][range(0, *pCount)] Array of power limit descriptors.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<zes_pwr_object_t*>( hPower )->dditable;
        auto pfnSetLimitsExt = dditable->zes.Power.pfnSetLimitsExt;
        if( nullptr == pfnSetLimitsExt )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hPower = reinterpret_cast<zes_pwr_object_t*>( hPower )->handle;

        // forward to device-driver
        result = pfnSetLimitsExt( hPower, pCount, pSustained );

        return result;
    }